

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

void Cmd_acsprofile(FCommandLine *argv,APlayerPawn *who,int key)

{
  long lVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  _func_int_void_ptr_void_ptr *p_Var5;
  size_t __n;
  size_t sVar6;
  uint local_84;
  uint j;
  size_t optlen;
  long num;
  char *endptr;
  int i;
  _func_int_void_ptr_void_ptr *sorter;
  long limit;
  undefined1 local_40 [8];
  TArray<ProfileCollector,_ProfileCollector> FuncProfiles;
  TArray<ProfileCollector,_ProfileCollector> ScriptProfiles;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  TArray<ProfileCollector,_ProfileCollector>::TArray
            ((TArray<ProfileCollector,_ProfileCollector> *)&FuncProfiles.Most);
  TArray<ProfileCollector,_ProfileCollector>::TArray
            ((TArray<ProfileCollector,_ProfileCollector> *)local_40);
  sorter = (_func_int_void_ptr_void_ptr *)0xa;
  _i = sort_by_total_instr;
  ArrangeScriptProfiles((TArray<ProfileCollector,_ProfileCollector> *)&FuncProfiles.Most);
  ArrangeFunctionProfiles((TArray<ProfileCollector,_ProfileCollector> *)local_40);
  iVar2 = FCommandLine::argc(argv);
  if (1 < iVar2) {
    pcVar4 = FCommandLine::operator[](argv,1);
    iVar2 = strcasecmp(pcVar4,"clear");
    if (iVar2 == 0) {
      ClearProfiles((TArray<ProfileCollector,_ProfileCollector> *)&FuncProfiles.Most);
      ClearProfiles((TArray<ProfileCollector,_ProfileCollector> *)local_40);
      endptr._4_4_ = 1;
      goto LAB_004ff070;
    }
    for (endptr._0_4_ = 1; iVar2 = (int)endptr, iVar3 = FCommandLine::argc(argv), iVar2 < iVar3;
        endptr._0_4_ = (int)endptr + 1) {
      pcVar4 = FCommandLine::operator[](argv,(int)endptr);
      p_Var5 = (_func_int_void_ptr_void_ptr *)strtol(pcVar4,(char **)&num,0);
      lVar1 = num;
      pcVar4 = FCommandLine::operator[](argv,(int)endptr);
      if ((char *)lVar1 == pcVar4) {
        pcVar4 = FCommandLine::operator[](argv,(int)endptr);
        __n = strlen(pcVar4);
        for (local_84 = 0; local_84 < 5; local_84 = local_84 + 1) {
          if (("\x01\x02\x02\x01\x01"[local_84] <= __n) &&
             (sVar6 = strlen(Cmd_acsprofile::sort_names[local_84]), __n <= sVar6)) {
            pcVar4 = FCommandLine::operator[](argv,(int)endptr);
            iVar2 = strncasecmp(pcVar4,Cmd_acsprofile::sort_names[local_84],__n);
            if (iVar2 == 0) {
              _i = Cmd_acsprofile::sort_funcs[local_84];
              break;
            }
          }
        }
        p_Var5 = sorter;
        if (local_84 == 5) {
          pcVar4 = FCommandLine::operator[](argv,(int)endptr);
          Printf("Unknown option \'%s\'\n",pcVar4);
          Printf("acsprofile clear : Reset profiling information\n");
          Printf("acsprofile [total|min|max|avg|runs] [<limit>]\n");
          endptr._4_4_ = 1;
          goto LAB_004ff070;
        }
      }
      sorter = p_Var5;
    }
  }
  ShowProfileData((TArray<ProfileCollector,_ProfileCollector> *)&FuncProfiles.Most,(long)sorter,_i,
                  false);
  ShowProfileData((TArray<ProfileCollector,_ProfileCollector> *)local_40,(long)sorter,_i,true);
  endptr._4_4_ = 0;
LAB_004ff070:
  TArray<ProfileCollector,_ProfileCollector>::~TArray
            ((TArray<ProfileCollector,_ProfileCollector> *)local_40);
  TArray<ProfileCollector,_ProfileCollector>::~TArray
            ((TArray<ProfileCollector,_ProfileCollector> *)&FuncProfiles.Most);
  return;
}

Assistant:

CCMD(acsprofile)
{
	static int (*sort_funcs[])(const void*, const void *) =
	{
		sort_by_total_instr,
		sort_by_min,
		sort_by_max,
		sort_by_avg,
		sort_by_runs
	};
	static const char *sort_names[] = { "total", "min", "max", "avg", "runs" };
	static const BYTE sort_match_len[] = {   1,     2,     2,     1,      1 };

	TArray<ProfileCollector> ScriptProfiles, FuncProfiles;
	long limit = 10;
	int (*sorter)(const void *, const void *) = sort_by_total_instr;

	assert(countof(sort_names) == countof(sort_match_len));

	ArrangeScriptProfiles(ScriptProfiles);
	ArrangeFunctionProfiles(FuncProfiles);

	if (argv.argc() > 1)
	{
		// `acsprofile clear` will zero all profiling information collected so far.
		if (stricmp(argv[1], "clear") == 0)
		{
			ClearProfiles(ScriptProfiles);
			ClearProfiles(FuncProfiles);
			return;
		}
		for (int i = 1; i < argv.argc(); ++i)
		{
			// If it's a number, set the display limit.
			char *endptr;
			long num = strtol(argv[i], &endptr, 0);
			if (endptr != argv[i])
			{
				limit = num;
				continue;
			}
			// If it's a name, set the sort method. We accept partial matches for
			// options that are shorter than the sort name.
			size_t optlen = strlen(argv[i]);
			unsigned int j;
			for (j = 0; j < countof(sort_names); ++j)
			{
				if (optlen < sort_match_len[j] || optlen > strlen(sort_names[j]))
				{ // Too short or long to match.
					continue;
				}
				if (strnicmp(argv[i], sort_names[j], optlen) == 0)
				{
					sorter = sort_funcs[j];
					break;
				}
			}
			if (j == countof(sort_names))
			{
				Printf("Unknown option '%s'\n", argv[i]);
				Printf("acsprofile clear : Reset profiling information\n");
				Printf("acsprofile [total|min|max|avg|runs] [<limit>]\n");
				return;
			}
		}
	}

	ShowProfileData(ScriptProfiles, limit, sorter, false);
	ShowProfileData(FuncProfiles, limit, sorter, true);
}